

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O0

void __thiscall
MedianFilterCV_8U::setSourceImage(MedianFilterCV_8U *this,uchar **matrix,int rows,int cols)

{
  byte bVar1;
  Mat *pMVar2;
  unsigned_short *puVar3;
  int local_34;
  int local_30;
  int j;
  int i;
  int cols_local;
  int rows_local;
  uchar **matrix_local;
  MedianFilterCV_8U *this_local;
  
  pMVar2 = this->sourceImage;
  if (pMVar2 != (Mat *)0x0) {
    cv::Mat::~Mat(pMVar2);
    operator_delete(pMVar2,0x60);
  }
  pMVar2 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(pMVar2,rows,cols,0);
  this->sourceImage = pMVar2;
  for (local_30 = 0; local_30 < rows; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < cols; local_34 = local_34 + 1) {
      bVar1 = matrix[local_30][local_34];
      puVar3 = cv::Mat::at<unsigned_short>(this->sourceImage,local_30,local_34);
      *puVar3 = (ushort)bVar1;
    }
  }
  return;
}

Assistant:

void MedianFilterCV_8U::setSourceImage(const uchar **matrix, int rows, int cols) {
    delete sourceImage;

    sourceImage = new cv::Mat(rows, cols, CV_8U);
    for (int i = 0; i < rows; ++i) {
        for (int j = 0; j < cols; ++j) {
            sourceImage->at<ushort>(i, j) = matrix[i][j];
        }
    }
}